

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O2

void __thiscall
vkt::sr::anon_unknown_0::OperatorShaderEvaluator::evaluate
          (OperatorShaderEvaluator *this,ShaderEvalContext *ctx)

{
  int iVar1;
  int channelNdx;
  long lVar2;
  
  (*this->m_evalFunc)(ctx);
  iVar1 = this->m_resultScalarSize;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    if (sr::(anonymous_namespace)::s_outSwizzleChannelMasks[lVar2 + (long)(iVar1 + -1) * 4] ==
        '\x01') {
      (ctx->color).m_data[lVar2] =
           (ctx->color).m_data[lVar2] * this->m_evaluatedScale + this->m_evaluatedBias;
    }
  }
  return;
}

Assistant:

virtual void evaluate (ShaderEvalContext& ctx) const
	{
		m_evalFunc(ctx);

		for (int channelNdx = 0; channelNdx < 4; channelNdx++)
			if (s_outSwizzleChannelMasks[m_resultScalarSize - 1][channelNdx])
				ctx.color[channelNdx] = ctx.color[channelNdx] * m_evaluatedScale + m_evaluatedBias;
	}